

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O1

bool __thiscall
CppUnit::ProtectorChain::protect(ProtectorChain *this,Functor *functor,ProtectorContext *context)

{
  _Map_pointer pppPVar1;
  _Elt_pointer ppPVar2;
  Protector *pPVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  Functor *pFVar9;
  long lVar10;
  Protector **ppPVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auStack_98 [8];
  Functors functors;
  
  if ((this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    auStack_98 = (undefined1  [8])0x0;
    functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::_M_initialize_map
              ((_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)auStack_98,0)
    ;
    pppPVar1 = (this->m_protectors).
               super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar6 = ((int)((ulong)((long)(this->m_protectors).
                                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)(this->m_protectors).
                                super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
             (int)((ulong)((long)(this->m_protectors).
                                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_protectors).
                                super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)pppPVar1 -
                     *(int *)&(this->m_protectors).
                              super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(pppPVar1 == (_Map_pointer)0x0)) * 0x40) - 1;
    if (-1 < (int)uVar6) {
      lVar14 = (ulong)uVar6 * 8;
      uVar12 = (ulong)uVar6;
      do {
        pFVar9 = functor;
        if (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node !=
            (_Map_pointer)
            functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_map_size) {
          pFVar9 = (Functor *)
                   functors.
                   super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node ==
              functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur) {
            pFVar9 = functors.
                     super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
          }
          pFVar9 = (Functor *)pFVar9[-1]._vptr_Functor;
        }
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)operator_new(0x20);
        ppPVar2 = (this->m_protectors).
                  super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar10 = (long)ppPVar2 -
                 (long)(this->m_protectors).
                       super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
        uVar8 = lVar10 + uVar12;
        if (uVar8 < 0x40) {
          ppPVar11 = (Protector **)((long)ppPVar2 + lVar14);
        }
        else {
          uVar13 = uVar8 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar8) {
            uVar13 = uVar8 >> 6;
          }
          ppPVar11 = (this->m_protectors).
                     super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                     lVar10 + uVar13 * -0x40 + uVar12;
        }
        pPVar3 = *ppPVar11;
        *functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl
         .super__Deque_impl_data._M_finish._M_node = (Functor **)&PTR__Functor_00142a08;
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node[1] = (Functor **)pPVar3;
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node[2] = (Functor **)pFVar9;
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node[3] = (Functor **)context;
        std::deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>>::
        emplace_back<CppUnit::Functor*>
                  ((deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>> *)auStack_98,
                   (Functor **)
                   &functors.
                    super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
        lVar14 = lVar14 + -8;
        bVar4 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar4);
    }
    pFVar9 = (Functor *)
             functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
    if ((_Elt_pointer)
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node ==
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      pFVar9 = functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last[-1] + 0x40;
    }
    uVar5 = (*(code *)((Functor *)*pFVar9[-1]._vptr_Functor)[2]._vptr_Functor)();
    uVar6 = 0;
    while( true ) {
      uVar12 = (ulong)uVar6;
      pppPVar1 = (this->m_protectors).
                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (((long)(this->m_protectors).
                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->m_protectors).
                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)(this->m_protectors).
                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->m_protectors).
                 super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)pppPVar1 -
                    (long)(this->m_protectors).
                          super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppPVar1 == (_Map_pointer)0x0)) * 0x40 <= uVar12) break;
      uVar8 = ((long)(functors.
                      super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                      _M_impl.super__Deque_impl_data._M_map_size -
                     (long)functors.
                           super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) + uVar12;
      if (uVar8 < 0x40) {
        pFVar9 = (Functor *)
                 (functors.
                  super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl
                  .super__Deque_impl_data._M_map_size + uVar12 * 8);
      }
      else {
        uVar12 = uVar8 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar8) {
          uVar12 = uVar8 >> 6;
        }
        pFVar9 = functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last[uVar12] + uVar8 + uVar12 * -0x40;
      }
      if (pFVar9->_vptr_Functor != (_func_int **)0x0) {
        (**(code **)(*pFVar9->_vptr_Functor + 8))();
      }
      uVar6 = uVar6 + 1;
    }
    std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::~_Deque_base
              ((_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_> *)auStack_98);
    return (bool)uVar5;
  }
  iVar7 = (*functor->_vptr_Functor[2])(functor);
  return SUB41(iVar7,0);
}

Assistant:

bool 
ProtectorChain::protect( const Functor &functor,
                         const ProtectorContext &context )
{
  if ( m_protectors.empty() )
    return functor();

  Functors functors;
  for ( int index = m_protectors.size()-1; index >= 0; --index )
  {
    const Functor &protectedFunctor = 
              functors.empty() ? functor : *functors.back();

    functors.push_back( new ProtectFunctor( m_protectors[index],
                                            protectedFunctor, 
                                            context ) );
  }

  const Functor &outermostFunctor = *functors.back();
  bool succeed = outermostFunctor();

  for ( unsigned int deletingIndex = 0; deletingIndex < m_protectors.size(); ++deletingIndex )
    delete functors[deletingIndex];

  return succeed;
}